

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# model.cc
# Opt level: O0

int ipx::CheckVectors(Int m,Int n,double *rhs,char *constr_type,double *obj,double *lb,double *ub)

{
  double *pdVar1;
  double dVar2;
  bool bVar3;
  long in_RCX;
  long in_RDX;
  int in_ESI;
  int in_EDI;
  long in_R8;
  long in_R9;
  Int i_1;
  Int j_1;
  Int j;
  Int i;
  int local_40;
  int local_3c;
  int local_38;
  int local_34;
  
  for (local_34 = 0; local_34 < in_EDI; local_34 = local_34 + 1) {
    bVar3 = std::isfinite(*(double *)(in_RDX + (long)local_34 * 8));
    if (!bVar3) {
      return -1;
    }
  }
  for (local_38 = 0; local_38 < in_ESI; local_38 = local_38 + 1) {
    bVar3 = std::isfinite(*(double *)(in_R8 + (long)local_38 * 8));
    if (!bVar3) {
      return -2;
    }
  }
  local_3c = 0;
  while( true ) {
    if (in_ESI <= local_3c) {
      local_40 = 0;
      while( true ) {
        if (in_EDI <= local_40) {
          return 0;
        }
        if (((*(char *)(in_RCX + local_40) != '=') && (*(char *)(in_RCX + local_40) != '<')) &&
           (*(char *)(in_RCX + local_40) != '>')) break;
        local_40 = local_40 + 1;
      }
      return -4;
    }
    bVar3 = std::isfinite(*(double *)(in_R9 + (long)local_3c * 8));
    if ((!bVar3) &&
       ((dVar2 = *(double *)(in_R9 + (long)local_3c * 8), dVar2 != -INFINITY || (NAN(dVar2)))))
    break;
    bVar3 = std::isfinite(*(double *)(_i_1 + (long)local_3c * 8));
    if ((!bVar3) &&
       ((dVar2 = *(double *)(_i_1 + (long)local_3c * 8), dVar2 != INFINITY || (NAN(dVar2))))) {
      return -3;
    }
    dVar2 = *(double *)(in_R9 + (long)local_3c * 8);
    pdVar1 = (double *)(_i_1 + (long)local_3c * 8);
    if (*pdVar1 <= dVar2 && dVar2 != *pdVar1) {
      return -3;
    }
    local_3c = local_3c + 1;
  }
  return -3;
}

Assistant:

static int CheckVectors(Int m, Int n, const double* rhs,const char* constr_type,
                        const double* obj, const double* lb, const double* ub) {
    for (Int i = 0; i < m; i++)
        if (!std::isfinite(rhs[i]))
            return -1;
    for (Int j = 0; j < n; j++)
        if (!std::isfinite(obj[j]))
            return -2;
    for (Int j = 0; j < n; j++) {
        if (!std::isfinite(lb[j]) && lb[j] != -INFINITY)
            return -3;
        if (!std::isfinite(ub[j]) && ub[j] != INFINITY)
            return -3;
        if (lb[j] > ub[j])
            return -3;
    }
    for (Int i = 0; i < m; i++)
        if (constr_type[i] != '=' && constr_type[i] != '<' &&
            constr_type[i] != '>')
            return -4;
    return 0;
}